

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::EndRenderPass
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  COMMAND_QUEUE_TYPE CVar1;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  Uint32 SubpassIndex;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  CVar1 = (this->m_Desc).QueueType;
  if (CVar1 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"EndRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x61e);
      std::__cxx11::string::~string((string *)&local_58);
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x61e);
    std::__cxx11::string::~string((string *)&local_58);
    CVar1 = (this->m_Desc).QueueType;
    in_DL = extraout_DL;
  }
  if ((~CVar1 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar1,in_DL);
    in_R8 = " queue.";
    FormatString<char[14],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)0x6e9f82,(char (*) [14])0x7e8bba,(char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x61e);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_pActiveRenderPass).m_pObject == (RenderPassVkImpl *)0x0) {
    FormatString<char[31]>(&local_58,(char (*) [31])"There is no active render pass");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x61f);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_pBoundFramebuffer).m_pObject == (FramebufferVkImpl *)0x0) {
    FormatString<char[31]>(&local_58,(char (*) [31])"There is no active framebuffer");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x620);
    std::__cxx11::string::~string((string *)&local_58);
  }
  SubpassIndex = this->m_SubpassIndex + 1;
  if ((((this->m_pActiveRenderPass).m_pObject)->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount != SubpassIndex) {
    FormatString<char[31],unsigned_int,char[35]>
              (&local_58,(Diligent *)"Ending render pass at subpass ",
               (char (*) [31])&this->m_SubpassIndex,(uint *)" before reaching the final subpass",
               (char (*) [35])in_R8);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x622);
    std::__cxx11::string::~string((string *)&local_58);
    SubpassIndex = this->m_SubpassIndex + 1;
  }
  UpdateAttachmentStates(this,SubpassIndex);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::Release(&this->m_pActiveRenderPass);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::Release(&this->m_pBoundFramebuffer);
  this->m_SubpassIndex = 0;
  this->m_RenderPassAttachmentsTransitionMode = RESOURCE_STATE_TRANSITION_MODE_NONE;
  (*(this->super_ObjectBase<Diligent::IDeviceContextVk>).
    super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
    super_IObject._vptr_IObject[0x51])(this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EndRenderPass()
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "EndRenderPass");
    DEV_CHECK_ERR(m_pActiveRenderPass != nullptr, "There is no active render pass");
    DEV_CHECK_ERR(m_pBoundFramebuffer != nullptr, "There is no active framebuffer");
    VERIFY(m_pActiveRenderPass->GetDesc().SubpassCount == m_SubpassIndex + 1,
           "Ending render pass at subpass ", m_SubpassIndex, " before reaching the final subpass");

    UpdateAttachmentStates(m_SubpassIndex + 1);

    m_pActiveRenderPass.Release();
    m_pBoundFramebuffer.Release();
    m_SubpassIndex                        = 0;
    m_RenderPassAttachmentsTransitionMode = RESOURCE_STATE_TRANSITION_MODE_NONE;
    ResetRenderTargets();
}